

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inference.cpp
# Opt level: O0

void __thiscall Kernel::Inference::Inference(Inference *this,GeneratingInferenceMany *gi)

{
  Inference *this_00;
  uint *puVar1;
  UnitList *in_RSI;
  long in_RDI;
  Inference *unaff_retaddr;
  Unit *prem;
  UnitList *it;
  uint local_24;
  Unit *local_20;
  List<Kernel::Unit_*> *local_18;
  
  initMany(unaff_retaddr,(InferenceRule)((ulong)in_RDI >> 0x38),in_RSI);
  *(undefined4 *)(in_RDI + 0xc) = 0;
  for (local_18 = in_RSI->_tail; local_18 != (List<Kernel::Unit_*> *)0x0;
      local_18 = Lib::List<Kernel::Unit_*>::tail(local_18)) {
    local_20 = Lib::List<Kernel::Unit_*>::head(local_18);
    this_00 = Unit::inference(local_20);
    local_24 = age(this_00);
    puVar1 = std::max<unsigned_int>((uint *)(in_RDI + 0xc),&local_24);
    *(uint *)(in_RDI + 0xc) = *puVar1;
  }
  *(int *)(in_RDI + 0xc) = *(int *)(in_RDI + 0xc) + 1;
  return;
}

Assistant:

Inference::Inference(const GeneratingInferenceMany& gi) {
  initMany(gi.rule,gi.premises);

  ASS_REP(isGeneratingInferenceRule(gi.rule),ruleName(gi.rule));
  _age = 0;
  UnitList* it= gi.premises;
  while(it) {
    Unit* prem = it->head();
    ASS(prem->isClause());
    _age = std::max(_age,prem->inference().age());
    it=it->tail();
  }
  _age++;
}